

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O0

int mqtt_client_send_message_response
              (MQTT_CLIENT_HANDLE handle,uint16_t packetId,QOS_VALUE qosValue)

{
  LOGGER_LOG p_Var1;
  MQTT_CLIENT *mqtt_client;
  LOGGER_LOG l;
  int result;
  QOS_VALUE qosValue_local;
  uint16_t packetId_local;
  MQTT_CLIENT_HANDLE handle_local;
  
  if ((handle == (MQTT_CLIENT_HANDLE)0x0) || (packetId == 0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                ,"mqtt_client_send_message_response",0x518,1,
                "Invalid parameter specified mqtt_client: %p, packetId: %d",handle,(uint)packetId);
    }
    l._4_4_ = 0x519;
  }
  else {
    SendMessageAck(handle,packetId,qosValue);
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int mqtt_client_send_message_response(MQTT_CLIENT_HANDLE handle, uint16_t packetId, QOS_VALUE qosValue)
{
    int result;

    if (handle == NULL || packetId == 0)
    {
        LogError("Invalid parameter specified mqtt_client: %p, packetId: %d", handle, packetId);
        result = MU_FAILURE;
    }
    else
    {
        MQTT_CLIENT* mqtt_client = (MQTT_CLIENT*)handle;
        SendMessageAck(mqtt_client, packetId, qosValue);
        result = 0;
    }

    return result;
}